

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::csharp::MessageGenerator::HasNestedGeneratedTypes
          (MessageGenerator *this)

{
  Descriptor *pDVar1;
  ulong uVar2;
  long *plVar3;
  ulong uVar4;
  
  pDVar1 = this->descriptor_;
  if (*(int *)(pDVar1 + 0x58) < 1) {
    uVar2 = (ulong)*(int *)(pDVar1 + 0x48);
    if ((long)uVar2 < 1) {
      return false;
    }
    plVar3 = (long *)(*(long *)(pDVar1 + 0x50) + 0x20);
    uVar4 = 0;
    while (*(char *)(*plVar3 + 0x6b) != '\0') {
      uVar4 = uVar4 + 1;
      plVar3 = plVar3 + 0x15;
      if (uVar2 == uVar4) {
        return uVar4 < uVar2;
      }
    }
  }
  return true;
}

Assistant:

bool MessageGenerator::HasNestedGeneratedTypes()
{
  if (descriptor_->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
      return true;
    }
  }
  return false;
}